

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertical.cpp
# Opt level: O0

void __thiscall
cppurses::layout::Vertical::distribute_space
          (Vertical *this,
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          *widgets,int height_left)

{
  value_type vVar1;
  int iVar2;
  bool bVar3;
  Type TVar4;
  size_t sVar5;
  size_t sVar6;
  reference pvVar7;
  reference pDVar8;
  size_t sVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Type policy_7;
  Dimensions_reference *d_7;
  iterator __end3_1;
  iterator __begin3_1;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range3_1;
  Type policy_6;
  Dimensions_reference *d_6;
  iterator __end3;
  iterator __begin3;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range3;
  int height_check;
  Type policy_5;
  Dimensions_reference *d_5;
  iterator __end2_5;
  iterator __begin2_5;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_5;
  Dimensions_reference *local_1c8;
  __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
  local_1c0;
  __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
  local_1b8;
  const_iterator local_1b0;
  ulong local_1a8;
  Type local_19c;
  reference pDStack_198;
  Type policy_4;
  Dimensions_reference *d_4;
  iterator __end2_4;
  iterator __begin2_4;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_4;
  Type policy_3;
  Dimensions_reference *d_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_3;
  Type policy_2;
  Dimensions_reference *d_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_2;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  local_120;
  Dimensions_reference *local_108;
  __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
  local_100;
  __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
  local_f8;
  const_iterator local_f0;
  ulong local_e8 [3];
  Type local_cc;
  reference pDStack_c8;
  Type policy_1;
  Dimensions_reference *d_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_1;
  int to_distribute;
  int index;
  deque<unsigned_long,_std::allocator<unsigned_long>_> height_additions;
  Type policy;
  Dimensions_reference *d;
  iterator __end2;
  iterator __begin2;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2;
  size_t total_stretch;
  int height_left_local;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *widgets_local;
  Vertical *this_local;
  
  __range2 = (vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
              *)0x0;
  __end2 = std::
           vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
           ::begin(widgets);
  d = (Dimensions_reference *)
      std::
      vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
      ::end(widgets);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                                     *)&d), bVar3) {
    pDVar8 = __gnu_cxx::
             __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
             ::operator*(&__end2);
    height_additions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node._4_4_ =
         Size_policy::type(&pDVar8->widget->height_policy);
    if ((height_additions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Deque_impl_data._M_finish._M_node._4_4_ == Expanding) ||
       (height_additions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node._4_4_ == MinimumExpanding)) {
      sVar5 = Size_policy::stretch(&pDVar8->widget->height_policy);
      __range2 = (vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                  *)((long)&(__range2->
                            super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                            )._M_impl.super__Vector_impl_data._M_start + sVar5);
    }
    __gnu_cxx::
    __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
    ::operator++(&__end2);
  }
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque
            ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_distribute);
  __range2_1._4_4_ = 0;
  __end2_1 = std::
             vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
             ::begin(widgets);
  d_1 = (Dimensions_reference *)
        std::
        vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
        ::end(widgets);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                             *)&d_1), bVar3) {
    pDStack_c8 = __gnu_cxx::
                 __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                 ::operator*(&__end2_1);
    local_cc = Size_policy::type(&pDStack_c8->widget->height_policy);
    if ((local_cc == Expanding) || (local_cc == MinimumExpanding)) {
      sVar5 = Size_policy::stretch(&pDStack_c8->widget->height_policy);
      auVar11._8_4_ = (int)(sVar5 >> 0x20);
      auVar11._0_8_ = sVar5;
      auVar11._12_4_ = 0x45300000;
      auVar13._8_4_ = (int)((ulong)__range2 >> 0x20);
      auVar13._0_8_ = __range2;
      auVar13._12_4_ = 0x45300000;
      dVar10 = (((auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) /
               ((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)__range2) - 4503599627370496.0))) *
               (double)height_left;
      local_e8[0] = (ulong)dVar10;
      local_e8[0] = local_e8[0] | (long)(dVar10 - 9.223372036854776e+18) & (long)local_e8[0] >> 0x3f
      ;
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_distribute,local_e8);
      sVar5 = *pDStack_c8->height;
      pvVar7 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::back
                         ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_distribute);
      vVar1 = *pvVar7;
      sVar9 = Size_policy::max_size(&pDStack_c8->widget->height_policy);
      if (sVar9 < sVar5 + vVar1) {
        sVar9 = Size_policy::max_size(&pDStack_c8->widget->height_policy);
        sVar5 = *pDStack_c8->height;
        sVar6 = Size_policy::max_size(&pDStack_c8->widget->height_policy);
        *pDStack_c8->height = sVar6;
        local_100._M_current =
             (Dimensions_reference *)
             std::
             begin<std::vector<cppurses::layout::Layout::Dimensions_reference,std::allocator<cppurses::layout::Layout::Dimensions_reference>>>
                       (widgets);
        local_f8 = __gnu_cxx::
                   __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                   ::operator+(&local_100,(long)__range2_1._4_4_);
        __gnu_cxx::
        __normal_iterator<cppurses::layout::Layout::Dimensions_reference_const*,std::vector<cppurses::layout::Layout::Dimensions_reference,std::allocator<cppurses::layout::Layout::Dimensions_reference>>>
        ::__normal_iterator<cppurses::layout::Layout::Dimensions_reference*>
                  ((__normal_iterator<cppurses::layout::Layout::Dimensions_reference_const*,std::vector<cppurses::layout::Layout::Dimensions_reference,std::allocator<cppurses::layout::Layout::Dimensions_reference>>>
                    *)&local_f0,&local_f8);
        local_108 = (Dimensions_reference *)
                    std::
                    vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                    ::erase(widgets,local_f0);
        std::
        vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
        ::vector(&local_120,widgets);
        distribute_space(this,&local_120,height_left + ((int)sVar9 - (int)sVar5));
        std::
        vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
        ::~vector(&local_120);
        goto LAB_00219f13;
      }
    }
    __range2_1._4_4_ = __range2_1._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
    ::operator++(&__end2_1);
  }
  __end2_2 = std::
             vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
             ::begin(widgets);
  d_2 = (Dimensions_reference *)
        std::
        vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
        ::end(widgets);
  total_stretch._4_4_ = height_left;
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                             *)&d_2), bVar3) {
    pDVar8 = __gnu_cxx::
             __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
             ::operator*(&__end2_2);
    TVar4 = Size_policy::type(&pDVar8->widget->height_policy);
    if ((TVar4 == Expanding) || (TVar4 == MinimumExpanding)) {
      pvVar7 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::front
                         ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_distribute);
      *pDVar8->height = *pvVar7 + *pDVar8->height;
      pvVar7 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::front
                         ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_distribute);
      total_stretch._4_4_ = total_stretch._4_4_ - (int)*pvVar7;
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front
                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_distribute);
    }
    __gnu_cxx::
    __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
    ::operator++(&__end2_2);
  }
  if (total_stretch._4_4_ != 0) {
    __range2 = (vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                *)0x0;
    __end2_3 = std::
               vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               ::begin(widgets);
    d_3 = (Dimensions_reference *)
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::end(widgets);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                               *)&d_3), bVar3) {
      pDVar8 = __gnu_cxx::
               __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
               ::operator*(&__end2_3);
      TVar4 = Size_policy::type(&pDVar8->widget->height_policy);
      if (((TVar4 == Preferred) || (TVar4 == Minimum)) || (TVar4 == Ignored)) {
        sVar5 = Size_policy::stretch(&pDVar8->widget->height_policy);
        __range2 = (vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                    *)((long)&(__range2->
                              super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                              )._M_impl.super__Vector_impl_data._M_start + sVar5);
      }
      __gnu_cxx::
      __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
      ::operator++(&__end2_3);
    }
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::clear
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_distribute);
    __range2_1._4_4_ = 0;
    __end2_4 = std::
               vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               ::begin(widgets);
    d_4 = (Dimensions_reference *)
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::end(widgets);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                               *)&d_4), bVar3) {
      pDStack_198 = __gnu_cxx::
                    __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                    ::operator*(&__end2_4);
      local_19c = Size_policy::type(&pDStack_198->widget->height_policy);
      if (((local_19c == Preferred) || (local_19c == Minimum)) || (local_19c == Ignored)) {
        sVar5 = Size_policy::stretch(&pDStack_198->widget->width_policy);
        auVar12._8_4_ = (int)(sVar5 >> 0x20);
        auVar12._0_8_ = sVar5;
        auVar12._12_4_ = 0x45300000;
        auVar14._8_4_ = (int)((ulong)__range2 >> 0x20);
        auVar14._0_8_ = __range2;
        auVar14._12_4_ = 0x45300000;
        dVar10 = (((auVar12._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) /
                 ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)__range2) - 4503599627370496.0))) *
                 (double)total_stretch._4_4_;
        local_1a8 = (ulong)dVar10;
        local_1a8 = local_1a8 | (long)(dVar10 - 9.223372036854776e+18) & (long)local_1a8 >> 0x3f;
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_distribute,&local_1a8
                  );
        sVar5 = *pDStack_198->height;
        pvVar7 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::back
                           ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_distribute);
        vVar1 = *pvVar7;
        sVar9 = Size_policy::max_size(&pDStack_198->widget->height_policy);
        if (sVar9 < sVar5 + vVar1) {
          sVar9 = Size_policy::max_size(&pDStack_198->widget->height_policy);
          sVar5 = *pDStack_198->height;
          sVar6 = Size_policy::max_size(&pDStack_198->widget->height_policy);
          *pDStack_198->height = sVar6;
          local_1c0._M_current =
               (Dimensions_reference *)
               std::
               begin<std::vector<cppurses::layout::Layout::Dimensions_reference,std::allocator<cppurses::layout::Layout::Dimensions_reference>>>
                         (widgets);
          local_1b8 = __gnu_cxx::
                      __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                      ::operator+(&local_1c0,(long)__range2_1._4_4_);
          __gnu_cxx::
          __normal_iterator<cppurses::layout::Layout::Dimensions_reference_const*,std::vector<cppurses::layout::Layout::Dimensions_reference,std::allocator<cppurses::layout::Layout::Dimensions_reference>>>
          ::__normal_iterator<cppurses::layout::Layout::Dimensions_reference*>
                    ((__normal_iterator<cppurses::layout::Layout::Dimensions_reference_const*,std::vector<cppurses::layout::Layout::Dimensions_reference,std::allocator<cppurses::layout::Layout::Dimensions_reference>>>
                      *)&local_1b0,&local_1b8);
          local_1c8 = (Dimensions_reference *)
                      std::
                      vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                      ::erase(widgets,local_1b0);
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::vector((vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                    *)&__range2_5,widgets);
          distribute_space(this,(vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                 *)&__range2_5,total_stretch._4_4_ + ((int)sVar5 - (int)sVar9));
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::~vector((vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                     *)&__range2_5);
          goto LAB_00219f13;
        }
      }
      __range2_1._4_4_ = __range2_1._4_4_ + 1;
      __gnu_cxx::
      __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
      ::operator++(&__end2_4);
    }
    __end2_5 = std::
               vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               ::begin(widgets);
    d_5 = (Dimensions_reference *)
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::end(widgets);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_5,
                              (__normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                               *)&d_5), bVar3) {
      pDVar8 = __gnu_cxx::
               __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
               ::operator*(&__end2_5);
      TVar4 = Size_policy::type(&pDVar8->widget->height_policy);
      if (((TVar4 == Preferred) || (TVar4 == Minimum)) || (TVar4 == Ignored)) {
        pvVar7 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::front
                           ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_distribute);
        *pDVar8->height = *pvVar7 + *pDVar8->height;
        pvVar7 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::front
                           ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_distribute);
        total_stretch._4_4_ = total_stretch._4_4_ - (int)*pvVar7;
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front
                  ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_distribute);
      }
      __gnu_cxx::
      __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
      ::operator++(&__end2_5);
    }
    if (total_stretch._4_4_ != 0) {
      do {
        iVar2 = total_stretch._4_4_;
        __end3 = std::
                 vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                 ::begin(widgets);
        d_6 = (Dimensions_reference *)
              std::
              vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
              ::end(widgets);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                                           *)&d_6), bVar3) {
          pDVar8 = __gnu_cxx::
                   __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                   ::operator*(&__end3);
          TVar4 = Size_policy::type(&pDVar8->widget->height_policy);
          if (((TVar4 == Expanding) || (TVar4 == MinimumExpanding)) &&
             ((0 < total_stretch._4_4_ &&
              (sVar5 = *pDVar8->height,
              sVar9 = Size_policy::max_size(&pDVar8->widget->height_policy), sVar5 + 1 <= sVar9))))
          {
            *pDVar8->height = *pDVar8->height + 1;
            total_stretch._4_4_ = total_stretch._4_4_ + -1;
          }
          __gnu_cxx::
          __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
          ::operator++(&__end3);
        }
      } while (iVar2 != total_stretch._4_4_);
      do {
        iVar2 = total_stretch._4_4_;
        __end3_1 = std::
                   vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                   ::begin(widgets);
        d_7 = (Dimensions_reference *)
              std::
              vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
              ::end(widgets);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                                   *)&d_7), bVar3) {
          pDVar8 = __gnu_cxx::
                   __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
                   ::operator*(&__end3_1);
          TVar4 = Size_policy::type(&pDVar8->widget->height_policy);
          if ((((TVar4 == Preferred) || (TVar4 == Minimum)) || (TVar4 == Ignored)) &&
             ((0 < total_stretch._4_4_ &&
              (sVar5 = *pDVar8->height,
              sVar9 = Size_policy::max_size(&pDVar8->widget->height_policy), sVar5 + 1 <= sVar9))))
          {
            *pDVar8->height = *pDVar8->height + 1;
            total_stretch._4_4_ = total_stretch._4_4_ + -1;
          }
          __gnu_cxx::
          __normal_iterator<cppurses::layout::Layout::Dimensions_reference_*,_std::vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>_>
          ::operator++(&__end3_1);
        }
      } while (iVar2 != total_stretch._4_4_);
    }
  }
LAB_00219f13:
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::~deque
            ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&to_distribute);
  return;
}

Assistant:

void Vertical::distribute_space(std::vector<Dimensions_reference> widgets,
                                int height_left) {
    // Find total stretch of first group
    std::size_t total_stretch{0};
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Expanding ||
            policy == Size_policy::MinimumExpanding) {
            total_stretch += d.widget->height_policy.stretch();
        }
    }

    // Calculate new heights of widgets in new group, if any go over max_height
    // then assign max value and recurse without that widget in vector.
    std::deque<std::size_t> height_additions;
    int index{0};
    auto to_distribute = height_left;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Expanding ||
            policy == Size_policy::MinimumExpanding) {
            height_additions.push_back((d.widget->height_policy.stretch() /
                                        static_cast<double>(total_stretch)) *
                                       to_distribute);
            if ((*d.height + height_additions.back()) >
                d.widget->height_policy.max_size()) {
                height_left += d.widget->height_policy.max_size() - *d.height;
                *d.height = d.widget->height_policy.max_size();
                widgets.erase(std::begin(widgets) + index);
                return distribute_space(widgets, height_left);
            }
        }
        ++index;
    }

    // If it has gotten this far, no widgets were over space, assign calculated
    // values
    for (Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Expanding ||
            policy == Size_policy::MinimumExpanding) {
            *d.height += height_additions.front();
            height_left -= height_additions.front();
            height_additions.pop_front();
        }
    }

    // SECOND GROUP - duplicate of above dependent on Policies to work with.
    // Preferred and Minimum
    if (height_left == 0) {
        return;
    }
    // Find total stretch
    total_stretch = 0;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Preferred ||
            policy == Size_policy::Minimum || policy == Size_policy::Ignored) {
            total_stretch += d.widget->height_policy.stretch();
        }
    }

    // Calculate new heights of widgets in new group, if any go over max_height
    // then assign max value and recurse without that widget in vector.
    height_additions.clear();
    index = 0;
    to_distribute = height_left;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Preferred ||
            policy == Size_policy::Minimum || policy == Size_policy::Ignored) {
            height_additions.push_back((d.widget->width_policy.stretch() /
                                        static_cast<double>(total_stretch)) *
                                       to_distribute);
            if ((*d.height + height_additions.back()) >
                d.widget->height_policy.max_size()) {
                height_left -= d.widget->height_policy.max_size() - *d.height;
                *d.height = d.widget->height_policy.max_size();
                widgets.erase(std::begin(widgets) + index);
                return distribute_space(widgets, height_left);
            }
        }
        ++index;
    }

    // If it has gotten this far, no widgets were over space, assign calculated
    // values
    for (Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Preferred ||
            policy == Size_policy::Minimum || policy == Size_policy::Ignored) {
            *d.height += height_additions.front();
            height_left -= height_additions.front();
            height_additions.pop_front();
        }
    }
    if (height_left == 0) {
        return;
    }
    // Rounding error extra
    // First Group
    auto height_check{0};
    do {
        height_check = height_left;
        for (Dimensions_reference& d : widgets) {
            auto policy = d.widget->height_policy.type();
            if ((policy == Size_policy::Expanding ||
                 policy == Size_policy::MinimumExpanding) &&
                height_left > 0) {
                if (*d.height + 1 <= d.widget->height_policy.max_size()) {
                    *d.height += 1;
                    height_left -= 1;
                }
            }
        }
    } while (height_check != height_left);

    // Second Group
    do {
        height_check = height_left;
        for (Dimensions_reference& d : widgets) {
            auto policy = d.widget->height_policy.type();
            if ((policy == Size_policy::Preferred ||
                 policy == Size_policy::Minimum ||
                 policy == Size_policy::Ignored) &&
                height_left > 0) {
                if (*d.height + 1 <= d.widget->height_policy.max_size()) {
                    *d.height += 1;
                    height_left -= 1;
                }
            }
        }
    } while (height_check != height_left);
}